

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_execution_limitations.cpp
# Opt level: O2

spv_result_t spvtools::val::ValidateExecutionLimitations(ValidationState_t *_,Instruction *inst)

{
  uint32_t entry_point;
  uint32_t *puVar1;
  bool bVar2;
  Function *this;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar3;
  set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
  *psVar4;
  _Base_ptr p_Var5;
  Function *entry_point_00;
  uint32_t *puVar6;
  spv_result_t unaff_EBP;
  spv_result_t local_29c;
  string reason;
  string local_248;
  string local_228;
  DiagnosticStream local_208;
  
  if ((inst->inst_).opcode == 0x36) {
    this = ValidationState_t::function(_,(inst->inst_).result_id);
    if (this == (Function *)0x0) {
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INTERNAL,inst);
      std::operator<<((ostream *)&local_208,"Internal error: missing function id ");
LAB_00581390:
      std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
      std::operator<<((ostream *)&local_208,".");
      DiagnosticStream::~DiagnosticStream(&local_208);
      local_29c = local_208.error_;
    }
    else {
      pvVar3 = ValidationState_t::FunctionEntryPoints(_,(inst->inst_).result_id);
      puVar6 = (pvVar3->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      puVar1 = (pvVar3->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      local_29c = unaff_EBP;
      do {
        if (puVar6 == puVar1) goto LAB_00581357;
        entry_point = *puVar6;
        psVar4 = ValidationState_t::GetExecutionModels(_,entry_point);
        if (psVar4 != (set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
                       *)0x0) {
          if ((psVar4->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0) {
            ValidationState_t::diag(&local_208,_,SPV_ERROR_INTERNAL,inst);
            std::operator<<((ostream *)&local_208,
                            "Internal error: empty execution models for function id ");
            goto LAB_00581390;
          }
          for (p_Var5 = (psVar4->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var5 != &(psVar4->_M_t)._M_impl.super__Rb_tree_header;
              p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
            reason._M_dataplus._M_p = (pointer)&reason.field_2;
            reason._M_string_length = 0;
            reason.field_2._M_local_buf[0] = '\0';
            bVar2 = Function::IsCompatibleWithExecutionModel(this,p_Var5[1]._M_color,&reason);
            if (!bVar2) {
              ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
              std::operator<<((ostream *)&local_208,"OpEntryPoint Entry Point <id> ");
              ValidationState_t::getIdName_abi_cxx11_(&local_248,_,entry_point);
              std::operator<<((ostream *)&local_208,(string *)&local_248);
              std::operator<<((ostream *)&local_208,"s callgraph contains function <id> ");
              ValidationState_t::getIdName_abi_cxx11_(&local_228,_,(inst->inst_).result_id);
              std::operator<<((ostream *)&local_208,(string *)&local_228);
              std::operator<<((ostream *)&local_208,
                              ", which cannot be used with the current execution model:\n");
              std::operator<<((ostream *)&local_208,(string *)&reason);
              local_29c = local_208.error_;
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              DiagnosticStream::~DiagnosticStream(&local_208);
            }
            std::__cxx11::string::_M_dispose();
            if (!bVar2) {
              return local_29c;
            }
          }
        }
        reason._M_dataplus._M_p = (pointer)&reason.field_2;
        reason._M_string_length = 0;
        reason.field_2._M_local_buf[0] = '\0';
        entry_point_00 = ValidationState_t::function(_,entry_point);
        bVar2 = Function::CheckLimitations(this,_,entry_point_00,&reason);
        if (!bVar2) {
          ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
          std::operator<<((ostream *)&local_208,"OpEntryPoint Entry Point <id> ");
          ValidationState_t::getIdName_abi_cxx11_(&local_248,_,entry_point);
          std::operator<<((ostream *)&local_208,(string *)&local_248);
          std::operator<<((ostream *)&local_208,"s callgraph contains function <id> ");
          ValidationState_t::getIdName_abi_cxx11_(&local_228,_,(inst->inst_).result_id);
          std::operator<<((ostream *)&local_208,(string *)&local_228);
          std::operator<<((ostream *)&local_208,
                          ", which cannot be used with the current execution modes:\n");
          std::operator<<((ostream *)&local_208,(string *)&reason);
          local_29c = local_208.error_;
          std::__cxx11::string::_M_dispose();
          std::__cxx11::string::_M_dispose();
          DiagnosticStream::~DiagnosticStream(&local_208);
        }
        std::__cxx11::string::_M_dispose();
        puVar6 = puVar6 + 1;
      } while (bVar2);
    }
  }
  else {
LAB_00581357:
    local_29c = SPV_SUCCESS;
  }
  return local_29c;
}

Assistant:

spv_result_t ValidateExecutionLimitations(ValidationState_t& _,
                                          const Instruction* inst) {
  if (inst->opcode() != spv::Op::OpFunction) {
    return SPV_SUCCESS;
  }

  const auto func = _.function(inst->id());
  if (!func) {
    return _.diag(SPV_ERROR_INTERNAL, inst)
           << "Internal error: missing function id " << inst->id() << ".";
  }

  for (uint32_t entry_id : _.FunctionEntryPoints(inst->id())) {
    const auto* models = _.GetExecutionModels(entry_id);
    if (models) {
      if (models->empty()) {
        return _.diag(SPV_ERROR_INTERNAL, inst)
               << "Internal error: empty execution models for function id "
               << entry_id << ".";
      }
      for (const auto model : *models) {
        std::string reason;
        if (!func->IsCompatibleWithExecutionModel(model, &reason)) {
          return _.diag(SPV_ERROR_INVALID_ID, inst)
                 << "OpEntryPoint Entry Point <id> " << _.getIdName(entry_id)
                 << "s callgraph contains function <id> "
                 << _.getIdName(inst->id())
                 << ", which cannot be used with the current execution "
                    "model:\n"
                 << reason;
        }
      }
    }

    std::string reason;
    if (!func->CheckLimitations(_, _.function(entry_id), &reason)) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "OpEntryPoint Entry Point <id> " << _.getIdName(entry_id)
             << "s callgraph contains function <id> " << _.getIdName(inst->id())
             << ", which cannot be used with the current execution "
                "modes:\n"
             << reason;
    }
  }
  return SPV_SUCCESS;
}